

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void loop_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  uint16_t uVar2;
  ushort uVar3;
  undefined4 *puVar4;
  uint16_t *in_RDX;
  m680x_info *in_RSI;
  long in_RDI;
  cs_m680x_op *op;
  uint8_t rel;
  uint8_t post_byte;
  cs_m680x *m680x;
  uint16_t *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  byte bVar5;
  byte bVar6;
  MCInst *MI_00;
  
  MI_00 = (MCInst *)&in_RSI->m680x;
  bVar6 = 0;
  bVar5 = 0;
  uVar2 = *in_RDX;
  *in_RDX = uVar2 + 1;
  read_byte(in_RSI,&stack0xffffffffffffffdf,uVar2);
  in_RSI->insn = loop_hdlr::index_to_insn_id[(int)(uint)bVar6 >> 5];
  if (in_RSI->insn == M680X_INS_ILLGL) {
    fprintf(_stderr,"Internal error: Unexpected post byte in loop instruction %02X.\n",(ulong)bVar6)
    ;
    illegal_hdlr(MI_00,(m680x_info *)CONCAT17(bVar6,CONCAT16(bVar5,in_stack_ffffffffffffffd8)),
                 in_stack_ffffffffffffffd0);
  }
  uVar2 = *in_RDX;
  *in_RDX = uVar2 + 1;
  read_byte(in_RSI,&stack0xffffffffffffffde,uVar2);
  add_reg_operand(in_RSI,loop_hdlr::index_to_reg_id[(int)(bVar6 & 7)]);
  bVar1 = *(uint8_t *)((long)&MI_00->OpcodePub + 1);
  *(byte *)((long)&MI_00->OpcodePub + 1) = bVar1 + 1;
  puVar4 = (undefined4 *)((long)MI_00->Operands + (ulong)bVar1 * 0x18 + -0xc);
  *puVar4 = 6;
  if ((bVar6 & 0x10) == 0) {
    uVar3 = (ushort)bVar5;
  }
  else {
    uVar3 = bVar5 | 0xff00;
  }
  *(ushort *)((long)puVar4 + 6) = uVar3;
  *(uint16_t *)(puVar4 + 1) = *in_RDX + *(short *)((long)puVar4 + 6);
  add_insn_group(*(cs_detail **)(*(long *)(in_RDI + 0x310) + 0xf0),M680X_GRP_BRAREL);
  return;
}

Assistant:

static void loop_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const m680x_reg index_to_reg_id[] = {
		M680X_REG_A, M680X_REG_B, M680X_REG_INVALID, M680X_REG_INVALID,
		M680X_REG_D, M680X_REG_X, M680X_REG_Y, M680X_REG_S,
	};
	static const m680x_insn index_to_insn_id[] = {
		M680X_INS_DBEQ, M680X_INS_DBNE, M680X_INS_TBEQ, M680X_INS_TBNE,
		M680X_INS_IBEQ, M680X_INS_IBNE, M680X_INS_ILLGL, M680X_INS_ILLGL
	};
	cs_m680x *m680x = &info->m680x;
	uint8_t post_byte = 0;
	uint8_t rel = 0;
	cs_m680x_op *op;

	read_byte(info, &post_byte, (*address)++);

	info->insn = index_to_insn_id[(post_byte >> 5) & 0x07];

	if (info->insn == M680X_INS_ILLGL) {
		fprintf(stderr, "Internal error: Unexpected post byte "
			"in loop instruction %02X.\n", post_byte);
		illegal_hdlr(MI, info, address);
	};

	read_byte(info, &rel, (*address)++);

	add_reg_operand(info, index_to_reg_id[post_byte & 0x07]);

	op = &m680x->operands[m680x->op_count++];

	op->type = M680X_OP_RELATIVE;

	op->rel.offset = (post_byte & 0x10) ? 0xff00 | rel : rel;

	op->rel.address = *address + op->rel.offset;

	add_insn_group(MI->flat_insn->detail, M680X_GRP_BRAREL);
}